

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

void Abc_ZddPrintTest(Abc_ZddMan *p)

{
  int b;
  int a;
  uint uVar1;
  uint uVar2;
  long lVar3;
  int pSets [3] [5];
  int local_68 [18];
  
  local_68[0xc] = 5;
  local_68[0xd] = 10;
  local_68[0xe] = 7;
  local_68[8] = 7;
  local_68[9] = 2;
  local_68[10] = 0;
  local_68[0xb] = 2;
  local_68[4] = 7;
  local_68[5] = 3;
  local_68[6] = 0xb;
  local_68[7] = 10;
  local_68[0] = 5;
  local_68[1] = 0;
  local_68[2] = 2;
  local_68[3] = 10;
  lVar3 = 0;
  a = 0;
  do {
    Abc_ZddPermPrint((int *)((long)local_68 + lVar3),5);
    b = Abc_ZddBuildSet(p,(int *)((long)local_68 + lVar3),5);
    a = Abc_ZddUnion(p,a,b);
    lVar3 = lVar3 + 0x14;
  } while (lVar3 != 0x3c);
  puts("Resulting set:");
  Abc_ZddPrint(p,a);
  putchar(10);
  uVar1 = Abc_ZddCount_rec(p,a);
  Abc_ZddUnmark_rec(p,a);
  uVar2 = Abc_ZddCountPaths(p,a);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

void Abc_ZddPrintTest( Abc_ZddMan * p )
{
//    int nSets = 2;
//    int Size = 2;
//    int pSets[2][2] = { {5, 0}, {3, 11} };
    int nSets = 3;
    int Size = 5;
    int pSets[3][5] = { {5, 0, 2, 10, 7}, {3, 11, 10, 7, 2}, {0, 2, 5, 10, 7} };
    int i, Set, Union = 0;
    for ( i = 0; i < nSets; i++ )
    {
        Abc_ZddPermPrint( pSets[i], Size );
        Set = Abc_ZddBuildSet( p, pSets[i], Size );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "Resulting set:\n" );
    Abc_ZddPrint( p, Union );
    printf( "\n" );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    Size = 0;
}